

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O2

bool __thiscall
bssl::SSLAEADContext::Open
          (SSLAEADContext *this,Span<unsigned_char> *out,uint8_t type,uint16_t record_version,
          uint64_t seqnum,Span<const_unsigned_char> header,Span<unsigned_char> in)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  ulong uVar6;
  ushort uVar7;
  byte bVar8;
  ulong __n;
  size_t i;
  ulong uVar9;
  ulong i_00;
  bool bVar10;
  Span<unsigned_char> SVar11;
  size_t len;
  uint8_t ad_storage [13];
  uint8_t nonce [32];
  
  if (this->cipher_ == (SSL_CIPHER *)0x0) {
    out->data_ = in.data_;
    out->size_ = in.size_;
    return true;
  }
  bVar1 = this->field_0x26a;
  if ((bVar1 & 8) == 0) {
    sVar4 = MaxOverhead(this);
    uVar2 = CONCAT11(ad_storage[9],ad_storage[10]);
    uVar7 = (short)in.size_ - (short)sVar4;
    if (sVar4 <= in.size_) {
      bVar1 = this->field_0x26a;
      goto LAB_0014a10f;
    }
    iVar3 = 0xf2;
LAB_0014a1db:
    ad_storage[9] = (uint8_t)(uVar2 >> 8);
    ad_storage[10] = (uint8_t)uVar2;
    bVar10 = false;
    ERR_put_error(0x10,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                  ,iVar3);
  }
  else {
    uVar7 = 0;
LAB_0014a10f:
    uVar9 = seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 | (seqnum & 0xff0000000000) >> 0x18
            | (seqnum & 0xff00000000) >> 8 | (seqnum & 0xff000000) << 8 |
            (seqnum & 0xff0000) << 0x18 | (seqnum & 0xff00) << 0x28 | seqnum << 0x38;
    uVar2 = CONCAT11(ad_storage[9],ad_storage[10]);
    if ((bVar1 & 0x10) == 0) {
      header.data_ = ad_storage;
      ad_storage._0_8_ = uVar9;
      ad_storage[8] = type;
      uVar2 = record_version;
      if ((bVar1 & 8) == 0) {
        ad_storage._11_2_ = uVar7 << 8 | uVar7 >> 8;
        header.size_ = 0xd;
      }
      else {
        header.size_ = 0xb;
      }
    }
    ad_storage[9] = (uint8_t)(uVar2 >> 8);
    ad_storage[10] = (uint8_t)uVar2;
    __n = (ulong)(this->fixed_nonce_).size_;
    bVar8 = bVar1 & 4;
    if (bVar8 == 0) {
      if (__n == 0) {
LAB_0014a1a5:
        __n = 0;
      }
      else {
        memcpy(nonce,&this->fixed_nonce_,__n);
        uVar2 = CONCAT11(ad_storage[9],ad_storage[10]);
      }
    }
    else {
      __n = __n - this->variable_nonce_len_;
      if (__n == 0) goto LAB_0014a1a5;
      memset(nonce,0,__n);
      uVar2 = CONCAT11(ad_storage[9],ad_storage[10]);
    }
    ad_storage[9] = (uint8_t)(uVar2 >> 8);
    ad_storage[10] = (uint8_t)uVar2;
    if ((bVar1 & 1) == 0) {
      if (this->variable_nonce_len_ != '\b') {
        __assert_fail("variable_nonce_len_ == 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x113,
                      "bool bssl::SSLAEADContext::Open(Span<uint8_t> *, uint8_t, uint16_t, uint64_t, Span<const uint8_t>, Span<uint8_t>)"
                     );
      }
      *(ulong *)(nonce + __n) = uVar9;
      uVar9 = 8;
    }
    else {
      uVar9 = (ulong)this->variable_nonce_len_;
      if (in.size_ < uVar9) {
        iVar3 = 0x10d;
        goto LAB_0014a1db;
      }
      if (uVar9 != 0) {
        memcpy(nonce + __n,in.data_,uVar9);
        uVar2 = CONCAT11(ad_storage[9],ad_storage[10]);
      }
      ad_storage[9] = (uint8_t)(uVar2 >> 8);
      ad_storage[10] = (uint8_t)uVar2;
      in = Span<unsigned_char>::subspan(&in,uVar9,0xffffffffffffffff);
      uVar2 = CONCAT11(ad_storage[9],ad_storage[10]);
      uVar9 = (ulong)this->variable_nonce_len_;
      bVar8 = this->field_0x26a & 4;
    }
    ad_storage[9] = (uint8_t)(uVar2 >> 8);
    ad_storage[10] = (uint8_t)uVar2;
    if (bVar8 != 0) {
      uVar6 = (ulong)(this->fixed_nonce_).size_;
      if (__n + uVar9 != uVar6) {
        __assert_fail("nonce_len == fixed_nonce_.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x11a,
                      "bool bssl::SSLAEADContext::Open(Span<uint8_t> *, uint8_t, uint16_t, uint64_t, Span<const uint8_t>, Span<uint8_t>)"
                     );
      }
      i_00 = 0;
      while( true ) {
        ad_storage[9] = (uint8_t)(uVar2 >> 8);
        ad_storage[10] = (uint8_t)uVar2;
        if (uVar6 <= i_00) break;
        pbVar5 = InplaceVector<unsigned_char,_32UL>::operator[](&this->fixed_nonce_,i_00);
        uVar2 = CONCAT11(ad_storage[9],ad_storage[10]);
        nonce[i_00] = nonce[i_00] ^ *pbVar5;
        i_00 = i_00 + 1;
        uVar6 = (ulong)(this->fixed_nonce_).size_;
      }
    }
    ad_storage[9] = (uint8_t)(uVar2 >> 8);
    ad_storage[10] = (uint8_t)uVar2;
    iVar3 = EVP_AEAD_CTX_open(&(this->ctx_).ctx_,in.data_,&len,in.size_,nonce,__n + uVar9,in.data_,
                              in.size_,header.data_,header.size_);
    bVar10 = iVar3 != 0;
    if (bVar10) {
      SVar11 = Span<unsigned_char>::subspan(&in,0,len);
      *out = SVar11;
    }
  }
  return bVar10;
}

Assistant:

bool SSLAEADContext::Open(Span<uint8_t> *out, uint8_t type,
                          uint16_t record_version, uint64_t seqnum,
                          Span<const uint8_t> header, Span<uint8_t> in) {
  if (is_null_cipher() || CRYPTO_fuzzer_mode_enabled()) {
    // Handle the initial NULL cipher.
    *out = in;
    return true;
  }

  // TLS 1.2 AEADs include the length in the AD and are assumed to have fixed
  // overhead. Otherwise the parameter is unused.
  size_t plaintext_len = 0;
  if (!omit_length_in_ad_) {
    size_t overhead = MaxOverhead();
    if (in.size() < overhead) {
      // Publicly invalid.
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_PACKET_LENGTH);
      return false;
    }
    plaintext_len = in.size() - overhead;
  }

  uint8_t ad_storage[13];
  Span<const uint8_t> ad = GetAdditionalData(ad_storage, type, record_version,
                                             seqnum, plaintext_len, header);

  // Assemble the nonce.
  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH];
  size_t nonce_len = 0;

  // Prepend the fixed nonce, or left-pad with zeros if XORing.
  if (xor_fixed_nonce_) {
    nonce_len = fixed_nonce_.size() - variable_nonce_len_;
    OPENSSL_memset(nonce, 0, nonce_len);
  } else {
    OPENSSL_memcpy(nonce, fixed_nonce_.data(), fixed_nonce_.size());
    nonce_len += fixed_nonce_.size();
  }

  // Add the variable nonce.
  if (variable_nonce_included_in_record_) {
    if (in.size() < variable_nonce_len_) {
      // Publicly invalid.
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_PACKET_LENGTH);
      return false;
    }
    OPENSSL_memcpy(nonce + nonce_len, in.data(), variable_nonce_len_);
    in = in.subspan(variable_nonce_len_);
  } else {
    assert(variable_nonce_len_ == 8);
    CRYPTO_store_u64_be(nonce + nonce_len, seqnum);
  }
  nonce_len += variable_nonce_len_;

  // XOR the fixed nonce, if necessary.
  if (xor_fixed_nonce_) {
    assert(nonce_len == fixed_nonce_.size());
    for (size_t i = 0; i < fixed_nonce_.size(); i++) {
      nonce[i] ^= fixed_nonce_[i];
    }
  }

  // Decrypt in-place.
  size_t len;
  if (!EVP_AEAD_CTX_open(ctx_.get(), in.data(), &len, in.size(), nonce,
                         nonce_len, in.data(), in.size(), ad.data(),
                         ad.size())) {
    return false;
  }
  *out = in.subspan(0, len);
  return true;
}